

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O1

void ihevc_intra_pred_chroma_mode_19_to_25
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  UWORD8 *pUVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  UWORD8 local_b8 [2];
  byte abStack_b6 [134];
  
  iVar1 = gai4_ihevc_ang_table_chroma[mode];
  iVar3 = nt * 2;
  uVar6 = nt * 2 + 2;
  if (0 < (int)uVar6) {
    uVar10 = 0;
    do {
      local_b8[uVar10 + (long)(iVar3 + -2)] = pu1_ref[uVar10 + (long)(nt * 4)];
      local_b8[iVar3 + -1 + (int)uVar10] = pu1_ref[uVar10 + (long)(nt * 4) + 1];
      uVar10 = uVar10 + 2;
    } while (uVar10 < uVar6);
  }
  lVar5 = (long)(iVar3 + -2);
  uVar6 = iVar1 * nt >> 4;
  if ((int)uVar6 < -2) {
    iVar2 = gai4_ihevc_ang_table_chroma[(long)mode + 0x18];
    iVar9 = iVar2 + 0x80;
    lVar7 = -2;
    do {
      uVar8 = iVar9 >> 7 & 0xfffffffe;
      local_b8[lVar7 + lVar5] = pu1_ref[(int)(nt * 4 - uVar8)];
      local_b8[lVar7 + lVar5 + 1] = pu1_ref[(int)((nt * 4 + 1) - uVar8)];
      lVar7 = lVar7 + -2;
      iVar9 = iVar9 + iVar2;
    } while ((int)(uVar6 & 0xfffffffe) < lVar7);
  }
  if (0 < nt) {
    pUVar4 = pu1_dst + 1;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + 1;
      if (0 < iVar3) {
        uVar8 = (int)uVar10 * iVar1;
        uVar6 = uVar8 & 0x1f;
        lVar7 = (int)((int)uVar8 >> 4 & 0xfffffffe) + lVar5;
        lVar11 = 0;
        do {
          pUVar4[lVar11 + -1] =
               (UWORD8)((uint)local_b8[lVar11 + lVar7 + 2] * (0x20 - uVar6) +
                        local_b8[lVar11 + lVar7 + 4] * uVar6 + 0x10 >> 5);
          pUVar4[lVar11] =
               (UWORD8)((uint)local_b8[lVar11 + lVar7 + 3] * (0x20 - uVar6) +
                        local_b8[lVar11 + lVar7 + 5] * uVar6 + 0x10 >> 5);
          lVar11 = lVar11 + 2;
        } while (lVar11 < iVar3);
      }
      pUVar4 = pUVar4 + dst_strd;
    } while (uVar10 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_19_to_25(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{

    WORD32 row, col, k;
    WORD32 intra_pred_ang, idx;
    WORD32 inv_ang, inv_ang_sum, pos, fract;
    WORD32 ref_main_idx_u, ref_main_idx_v, ref_idx;
    UWORD8 ref_temp[(2 * MAX_CU_SIZE) + 2];
    UWORD8 *ref_main;
    UNUSED(src_strd);


    intra_pred_ang = gai4_ihevc_ang_table_chroma[mode];
    inv_ang = gai4_ihevc_inv_ang_table_chroma[mode - 12];

    /* Intermediate reference samples for negative angle modes */
    /* This have to be removed during optimization*/
    /* For horizontal modes, (ref main = ref above) (ref side = ref left) */
    ref_main = ref_temp + 2 * nt;
    for(k = 0; k < (2 * (nt + 1)); k += 2)
    {
        ref_temp[k + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k];
        ref_temp[k + 1 + (2 * (nt - 1))] = pu1_ref[(4 * nt) + k + 1];
    }


    ref_idx = (nt * intra_pred_ang) >> 5;
    inv_ang_sum = 128;
    ref_main = ref_temp + (2 * (nt - 1));
    /* SIMD Optimization can be done using look-up table for the loop */
    /* For negative angled derive the main reference samples from side */
    /*  reference samples refer to section 8.4.4.2.6 */
    for(k = -2; k > (2 * ref_idx); k -= 2)
    {
        inv_ang_sum += inv_ang;
        ref_main[k] = pu1_ref[(4 * nt) - (inv_ang_sum >> 8) * 2];
        ref_main[k + 1] = pu1_ref[((4 * nt) + 1) - (inv_ang_sum >> 8) * 2];
    }

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);

        // Do linear filtering
        for(col = 0; col < (2 * nt); col += 2)
        {
            ref_main_idx_u = col + 2 * idx + 2;
            ref_main_idx_v = (col + 1) + 2 * idx + 2;
            pu1_dst[(row * dst_strd) + col] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_u]
                            + fract * ref_main[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(row * dst_strd) + (col + 1)] = (UWORD8)(((32 - fract)
                            * ref_main[ref_main_idx_v]
                            + fract * ref_main[ref_main_idx_v + 2] + 16) >> 5);

        }

    }

}